

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

_Bool CrawlNumbers(Lexer *lexer)

{
  int iVar1;
  ushort *puVar2;
  _Bool _Var3;
  ushort **ppuVar4;
  int iVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  
  iVar1 = lexer->length;
  iVar5 = (lexer->tracker).currentTokenPosition;
  cVar6 = -1;
  cVar7 = -1;
  if (iVar5 < iVar1) {
    cVar7 = lexer->rawSourceCode[iVar5];
  }
  lVar9 = (long)iVar5 + 1;
  iVar8 = (int)lVar9;
  (lexer->tracker).currentTokenPosition = iVar8;
  if (iVar8 < iVar1) {
    cVar6 = lexer->rawSourceCode[lVar9];
  }
  (lexer->tracker).currentTokenPosition = iVar5;
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  _Var3 = (_Bool)(cVar7 == '.' | (*(byte *)((long)puVar2 + (long)cVar7 * 2 + 1) & 8) >> 3);
  if (_Var3 == true) {
    (lexer->tracker).tokenStart = iVar5;
    if ((cVar6 == '.') || ((puVar2[cVar6] & 0x800) != 0)) {
      do {
        iVar5 = iVar5 + 1;
        (lexer->tracker).currentTokenPosition = iVar5;
        cVar7 = -1;
        if (lVar9 < iVar1) {
          cVar7 = lexer->rawSourceCode[lVar9];
        }
        lVar9 = lVar9 + 1;
      } while ((cVar7 == '.') || ((puVar2[cVar7] & 0x800) != 0));
    }
    else {
      (lexer->tracker).currentTokenPosition = iVar8;
      iVar5 = iVar8;
    }
    (lexer->tracker).tokenEnd = iVar5;
  }
  return _Var3;
}

Assistant:

bool CrawlNumbers(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	bool isTrailingPeriod = currentChar == '.';
	if (isdigit(currentChar) || isTrailingPeriod){
		SetTokenStart(lexer);
		bool inside = false;
		while (true){
			if (!isdigit(nextChar) && nextChar != '.') break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}